

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplugin_p.h
# Opt level: O3

bool __thiscall QPluginParsedMetaData::setError(QPluginParsedMetaData *this,QString *errorString)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  Type TVar3;
  long in_FS_OFFSET;
  qint64 local_48;
  QCborContainerPrivate *local_40;
  Type local_38;
  qint64 local_30;
  QCborContainerPrivate *local_28;
  Type local_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborValue::QCborValue((QCborValue *)&local_48,errorString);
  TVar3 = local_38;
  pQVar2 = local_40;
  local_40 = (QCborContainerPrivate *)0x0;
  local_38 = 0x117;
  local_30 = (this->data).n;
  (this->data).n = local_48;
  local_28 = (this->data).container;
  (this->data).container = pQVar2;
  TVar1 = (this->data).t;
  (this->data).t = TVar3;
  _local_20 = CONCAT44(0xaaaaaaaa,TVar1);
  QCborValue::~QCborValue((QCborValue *)&local_30);
  QCborValue::~QCborValue((QCborValue *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool setError(const QString &errorString) Q_DECL_COLD_FUNCTION
    {
        data = errorString;
        return false;
    }